

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O2

HelicsTime helicsInputGetTime(HelicsInput inp,HelicsError *err)

{
  InputObject *pIVar1;
  TimeRepresentation<count_time<9,_long>_> TVar2;
  HelicsTime HVar3;
  
  pIVar1 = anon_unknown.dwarf_694c0::verifyInput(inp,err);
  if (pIVar1 == (InputObject *)0x0) {
    HVar3 = -1.785e+39;
  }
  else {
    TVar2 = helics::Input::getValue_impl<TimeRepresentation<count_time<9,long>>>(pIVar1->inputPtr);
    HVar3 = (double)(TVar2.internalTimeCode % 1000000000) * 1e-09 +
            (double)(TVar2.internalTimeCode / 1000000000);
  }
  return HVar3;
}

Assistant:

HelicsTime helicsInputGetTime(HelicsInput inp, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);
    if (inpObj == nullptr) {
        return HELICS_TIME_INVALID;
    }
    try {
        auto time = inpObj->inputPtr->getValue<helics::Time>();
        return static_cast<HelicsTime>(time);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return HELICS_TIME_INVALID;
    }
    // LCOV_EXCL_STOP
}